

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_definitions_section.cpp
# Opt level: O2

ssize_t __thiscall
pstore::repo::linked_definitions_creation_dispatcher::write
          (linked_definitions_creation_dispatcher *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  linked_definitions *this_00;
  
  this_00 = (linked_definitions *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (*(this->super_section_creation_dispatcher)._vptr_section_creation_dispatcher[4])();
  if ((linked_definitions *)CONCAT44(extraout_var,iVar1) == this_00) {
    linked_definitions::linked_definitions<pstore::repo::linked_definitions::value_type_const*,void>
              (this_00,this->begin_,this->end_);
    return (ssize_t)(this_00->definitions_ + this_00->size_);
  }
  assert_failed("this->aligned (out) == out",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/linked_definitions_section.cpp"
                ,0x60);
}

Assistant:

std::uint8_t *
        linked_definitions_creation_dispatcher::write (std::uint8_t * const out) const {
            PSTORE_ASSERT (this->aligned (out) == out);
            auto * const dependent = new (out) linked_definitions (begin_, end_);
            return out + dependent->size_bytes ();
        }